

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::LogBuilder::convertToColoredOutput(LogBuilder *this,string_t *logLine,Level level)

{
  long *plVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  if (this->m_termSupportsColor != true) {
    return;
  }
  if ((int)level < 0x10) {
    if (level == Trace) {
      std::operator+(&local_58,"\x1b[35m",logLine);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
      goto LAB_00158ca6;
    }
    if (level == Debug) {
      std::operator+(&local_58,"\x1b[32m",logLine);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
      goto LAB_00158ca6;
    }
    if (level != Fatal) {
      return;
    }
  }
  else {
    if (level == Info) {
      std::operator+(&local_58,"\x1b[36m",logLine);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
      goto LAB_00158ca6;
    }
    if (level == Warning) {
      std::operator+(&local_58,"\x1b[33m",logLine);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
      goto LAB_00158ca6;
    }
    if (level != Error) {
      return;
    }
  }
  std::operator+(&local_58,"\x1b[31m",logLine);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
LAB_00158ca6:
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_28 = *plVar2;
    lStack_20 = plVar1[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar2;
    local_38 = (long *)*plVar1;
  }
  local_30 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)logLine,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LogBuilder::convertToColoredOutput(base::type::string_t* logLine, Level level) {
  if (!m_termSupportsColor) return;
  const base::type::char_t* resetColor = ELPP_LITERAL("\x1b[0m");
  if (level == Level::Error || level == Level::Fatal)
    *logLine = ELPP_LITERAL("\x1b[31m") + *logLine + resetColor;
  else if (level == Level::Warning)
    *logLine = ELPP_LITERAL("\x1b[33m") + *logLine + resetColor;
  else if (level == Level::Debug)
    *logLine = ELPP_LITERAL("\x1b[32m") + *logLine + resetColor;
  else if (level == Level::Info)
    *logLine = ELPP_LITERAL("\x1b[36m") + *logLine + resetColor;
  else if (level == Level::Trace)
    *logLine = ELPP_LITERAL("\x1b[35m") + *logLine + resetColor;
}